

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
HasMember(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *this,Ch *name)

{
  Number in_RAX;
  Number NVar1;
  undefined8 local_18;
  
  local_18 = in_RAX;
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffe8,(Ch *)this);
  NVar1.i = (I)MemberEnd(this);
  return local_18 != NVar1.i64;
}

Assistant:

bool HasMember(const Ch* name) const { return FindMember(name) != MemberEnd(); }